

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.h
# Opt level: O3

void __thiscall FeatureSet::~FeatureSet(FeatureSet *this)

{
  pointer piVar1;
  pointer pPVar2;
  
  piVar1 = (this->ages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  pPVar2 = (this->points).super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar2 != (pointer)0x0) {
    operator_delete(pPVar2);
    return;
  }
  return;
}

Assistant:

int size(){
        return points.size();
    }